

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O2

LinTerms * __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
::LinearizeGeneralProduct
          (LinTerms *__return_storage_ptr__,
          QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
          *this,double c,int x,int y)

{
  pointer pcVar1;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  _Type aiVar2;
  Var VVar3;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  allocator_type local_22a;
  allocator_type local_229;
  double local_228;
  _Type local_21c;
  _Vector_base<int,_std::allocator<int>_> local_218;
  _Vector_base<double,_std::allocator<double>_> local_200;
  int local_1e8;
  int local_1e4;
  undefined1 local_1e0 [48];
  array<double,_1UL> local_1b0;
  double local_138 [2];
  LinTerms local_128;
  AffineExpr local_b0;
  
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mdl_cvt_;
  local_138[0] = 1.0;
  local_138[1] = 1.0;
  __l._M_len = 2;
  __l._M_array = local_138;
  local_228 = c;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_200,__l,&local_229);
  __l_00._M_len = 2;
  __l_00._M_array = &local_1e8;
  local_1e8 = x;
  local_1e4 = y;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_218,__l_00,&local_22a);
  local_21c[0] = y;
  LinTerms::LinTerms(&local_128,(vector<double,_std::allocator<double>_> *)&local_200,
                     (vector<int,_std::allocator<int>_> *)&local_218);
  LinTerms::LinTerms(&local_b0.super_LinTerms,&local_128);
  local_b0.constant_term_ = 0.0;
  LinearFunctionalConstraint::LinearFunctionalConstraint
            ((LinearFunctionalConstraint *)local_1e0,&local_b0);
  aiVar2[0] = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::AssignResultVar2Args<mp::LinearFunctionalConstraint>
                        (this_00,(LinearFunctionalConstraint *)local_1e0);
  LinearFunctionalConstraint::~LinearFunctionalConstraint((LinearFunctionalConstraint *)local_1e0);
  LinTerms::~LinTerms(&local_b0.super_LinTerms);
  LinTerms::~LinTerms(&local_128);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_218);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_200);
  pcVar1 = local_1e0 + 0x10;
  local_1e0._8_8_ = 0;
  local_1e0[0x10] = '\0';
  local_1e0._32_4_ = -1;
  local_1e0._36_4_ = CTX_NONE;
  local_1b0._M_elems[0] = (_Type)2.0;
  local_1e0._0_8_ = pcVar1;
  local_1e0._40_4_ = aiVar2[0];
  VVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)(this->
                        super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        ).mdl_cvt_,
                     (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                      *)local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  LinTerms::add_term(__return_storage_ptr__,local_228 * 0.5,VVar3);
  local_1e0._8_8_ = 0;
  local_1e0[0x10] = '\0';
  local_1e0._32_4_ = -1;
  local_1e0._36_4_ = CTX_NONE;
  local_1b0._M_elems[0] = (_Type)2.0;
  local_1e0._0_8_ = pcVar1;
  local_1e0._40_4_ = x;
  VVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)(this->
                        super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        ).mdl_cvt_,
                     (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                      *)local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  local_228 = local_228 * -0.5;
  LinTerms::add_term(__return_storage_ptr__,local_228,VVar3);
  local_1e0._8_8_ = 0;
  local_1e0[0x10] = '\0';
  local_1e0._32_4_ = -1;
  local_1e0._36_4_ = CTX_NONE;
  local_1e0._40_4_ = local_21c[0];
  local_1b0._M_elems[0] = (_Type)2.0;
  local_1e0._0_8_ = pcVar1;
  VVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)(this->
                        super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        ).mdl_cvt_,
                     (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                      *)local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  LinTerms::add_term(__return_storage_ptr__,local_228,VVar3);
  return __return_storage_ptr__;
}

Assistant:

LinTerms LinearizeGeneralProduct(double c, int x, int y) {
    LinTerms lt;
    auto x_plus_y = GetMC().AssignResultVar2Args(
          LinearFunctionalConstraint{{  // = x+y
                                        { {1.0, 1.0}, {x, y} }, 0.0 }} );
    auto x_plus_y_pow2 = GetMC().AssignResultVar2Args(
          PowConstExpConstraint{  // no context as of now
                          VarArray1{x_plus_y}, {2.0} } );
    lt.add_term(0.5*c, x_plus_y_pow2);
    auto x_pow2 = GetMC().AssignResultVar2Args(
          PowConstExpConstraint{  // no context as of now
                          VarArray1{x}, {2.0} } );
    lt.add_term(-0.5*c, x_pow2);
    auto y_pow2 = GetMC().AssignResultVar2Args(
          PowConstExpConstraint{  // no context as of now
                          VarArray1{y}, {2.0} } );
    lt.add_term(-0.5*c, y_pow2);
    return lt;
  }